

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escape.c
# Opt level: O2

char * curl_easy_escape(Curl_easy *data,char *string,int inlength)

{
  byte bVar1;
  size_t sVar2;
  char *ptr;
  long lVar3;
  size_t sVar4;
  size_t sVar5;
  ulong local_48;
  
  if (-1 < inlength) {
    if (inlength == 0) {
      sVar2 = strlen(string);
    }
    else {
      sVar2 = (size_t)(uint)inlength;
    }
    sVar4 = sVar2 + 1;
    ptr = (char *)(*Curl_cmalloc)(sVar4);
    if (ptr != (char *)0x0) {
      sVar5 = 0;
      lVar3 = 0;
      local_48 = sVar4;
      do {
        if (sVar2 == sVar5) {
          ptr[lVar3] = '\0';
          return ptr;
        }
        bVar1 = string[sVar5];
        switch(bVar1) {
        case 0x2d:
        case 0x2e:
        case 0x30:
        case 0x31:
        case 0x32:
        case 0x33:
        case 0x34:
        case 0x35:
        case 0x36:
        case 0x37:
        case 0x38:
        case 0x39:
        case 0x41:
        case 0x42:
        case 0x43:
        case 0x44:
        case 0x45:
        case 0x46:
        case 0x47:
        case 0x48:
        case 0x49:
        case 0x4a:
        case 0x4b:
        case 0x4c:
        case 0x4d:
        case 0x4e:
        case 0x4f:
        case 0x50:
        case 0x51:
        case 0x52:
        case 0x53:
        case 0x54:
        case 0x55:
        case 0x56:
        case 0x57:
        case 0x58:
        case 0x59:
        case 0x5a:
        case 0x5f:
        case 0x61:
        case 0x62:
        case 99:
        case 100:
        case 0x65:
        case 0x66:
        case 0x67:
        case 0x68:
        case 0x69:
        case 0x6a:
        case 0x6b:
        case 0x6c:
        case 0x6d:
        case 0x6e:
        case 0x6f:
        case 0x70:
        case 0x71:
        case 0x72:
        case 0x73:
        case 0x74:
        case 0x75:
        case 0x76:
        case 0x77:
        case 0x78:
        case 0x79:
        case 0x7a:
        case 0x7e:
          ptr[lVar3] = bVar1;
          lVar3 = lVar3 + 1;
          break;
        default:
          sVar4 = sVar4 + 2;
          if (local_48 < sVar4) {
            local_48 = local_48 * 2;
            ptr = (char *)Curl_saferealloc(ptr,local_48);
            if (ptr == (char *)0x0) {
              return (char *)0x0;
            }
          }
          curl_msnprintf(ptr + lVar3,4,"%%%02X",(ulong)bVar1);
          lVar3 = lVar3 + 3;
        }
        sVar5 = sVar5 + 1;
      } while( true );
    }
  }
  return (char *)0x0;
}

Assistant:

char *curl_easy_escape(struct Curl_easy *data, const char *string,
                       int inlength)
{
  size_t alloc;
  char *ns;
  char *testing_ptr = NULL;
  unsigned char in; /* we need to treat the characters unsigned */
  size_t newlen;
  size_t strindex=0;
  size_t length;
  CURLcode result;

  if(inlength < 0)
    return NULL;

  alloc = (inlength?(size_t)inlength:strlen(string))+1;
  newlen = alloc;

  ns = malloc(alloc);
  if(!ns)
    return NULL;

  length = alloc-1;
  while(length--) {
    in = *string;

    if(Curl_isunreserved(in))
      /* just copy this */
      ns[strindex++]=in;
    else {
      /* encode it */
      newlen += 2; /* the size grows with two, since this'll become a %XX */
      if(newlen > alloc) {
        alloc *= 2;
        testing_ptr = Curl_saferealloc(ns, alloc);
        if(!testing_ptr)
          return NULL;
        ns = testing_ptr;
      }

      result = Curl_convert_to_network(data, &in, 1);
      if(result) {
        /* Curl_convert_to_network calls failf if unsuccessful */
        free(ns);
        return NULL;
      }

      snprintf(&ns[strindex], 4, "%%%02X", in);

      strindex+=3;
    }
    string++;
  }
  ns[strindex]=0; /* terminate it */
  return ns;
}